

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O2

char * duckdb::NumericHelper::FormatUnsigned<unsigned_int>(uint value,char *ptr)

{
  ulong uVar1;
  char cVar2;
  uint uVar3;
  long lStack_10;
  
  uVar1 = (ulong)value;
  while( true ) {
    uVar3 = (uint)uVar1;
    if (uVar3 < 100) break;
    *(undefined2 *)(ptr + -2) =
         *(undefined2 *)(duckdb_fmt::v6::internal::basic_data<void>::digits + (uVar1 % 100) * 2);
    ptr = ptr + -2;
    uVar1 = uVar1 / 100;
  }
  if (uVar3 < 10) {
    cVar2 = NumericCastImpl<char,_unsigned_int,_false>::Convert(uVar3 | 0x30);
    lStack_10 = -1;
  }
  else {
    ptr[-1] = duckdb_fmt::v6::internal::basic_data<void>::digits[(uVar1 * 2 & 0xffffffff) + 1];
    cVar2 = duckdb_fmt::v6::internal::basic_data<void>::digits[uVar1 * 2];
    lStack_10 = -2;
  }
  ptr[lStack_10] = cVar2;
  return ptr + lStack_10;
}

Assistant:

static char *FormatUnsigned(T value, char *ptr) {
		while (value >= 100) {
			// Integer division is slow so do it for a group of two digits instead
			// of for every digit. The idea comes from the talk by Alexandrescu
			// "Three Optimization Tips for C++".
			auto index = NumericCast<unsigned>((value % 100) * 2);
			value /= 100;
			*--ptr = duckdb_fmt::internal::data::digits[index + 1];
			*--ptr = duckdb_fmt::internal::data::digits[index];
		}
		if (value < 10) {
			*--ptr = NumericCast<char>('0' + value);
			return ptr;
		}
		auto index = NumericCast<unsigned>(value * 2);
		*--ptr = duckdb_fmt::internal::data::digits[index + 1];
		*--ptr = duckdb_fmt::internal::data::digits[index];
		return ptr;
	}